

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

void __thiscall
icu_63::Calendar::add(Calendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  char cVar1;
  UCalendarWallTimeOption UVar2;
  bool bVar3;
  UBool UVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  char *__s1;
  int32_t iVar8;
  int iVar9;
  uint uVar10;
  double dVar11;
  UDate base;
  double local_40;
  UDate immediatePrevTrans;
  undefined4 extraout_var;
  
  if (amount == 0) {
    return;
  }
  if (UCAL_MILLISECONDS_IN_DAY < field) {
switchD_001e9e59_caseD_f:
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  local_40 = (double)amount;
  iVar9 = 0;
  bVar3 = true;
  switch(field) {
  case UCAL_ERA:
    iVar8 = get(this,UCAL_ERA,status);
    set(this,UCAL_ERA,amount + iVar8);
    (*(this->super_UObject)._vptr_UObject[0x2c])(this,0,status);
    return;
  case UCAL_YEAR:
  case UCAL_YEAR_WOY:
    iVar8 = get(this,UCAL_ERA,status);
    if (iVar8 == 0) {
      iVar9 = (*(this->super_UObject)._vptr_UObject[0x17])(this);
      __s1 = (char *)CONCAT44(extraout_var,iVar9);
      iVar9 = strcmp(__s1,"gregorian");
      if (((iVar9 == 0) || (iVar9 = strcmp(__s1,"roc"), iVar9 == 0)) ||
         (iVar9 = strcmp(__s1,"coptic"), iVar9 == 0)) {
        amount = -amount;
      }
    }
  case UCAL_MONTH:
  case UCAL_EXTENDED_YEAR:
    cVar1 = this->fLenient;
    this->fLenient = '\x01';
    iVar8 = get(this,field,status);
    set(this,field,amount + iVar8);
    (*(this->super_UObject)._vptr_UObject[0x2c])(this,5,status);
    if (cVar1 != '\0') {
      return;
    }
    complete(this,status);
    this->fLenient = '\0';
    return;
  case UCAL_WEEK_OF_YEAR:
  case UCAL_WEEK_OF_MONTH:
  case UCAL_DAY_OF_WEEK_IN_MONTH:
    dVar11 = 604800000.0;
    break;
  default:
    dVar11 = 86400000.0;
    break;
  case UCAL_AM_PM:
    dVar11 = 43200000.0;
    break;
  case UCAL_HOUR:
  case UCAL_HOUR_OF_DAY:
    local_40 = local_40 * 3600000.0;
    goto LAB_001e9fee;
  case UCAL_MINUTE:
    local_40 = local_40 * 60000.0;
    goto LAB_001e9fee;
  case UCAL_SECOND:
    local_40 = local_40 * 1000.0;
LAB_001e9fee:
    iVar8 = 0;
    goto LAB_001e9ff6;
  case UCAL_MILLISECOND:
  case UCAL_MILLISECONDS_IN_DAY:
    iVar8 = 0;
    iVar9 = 0;
    goto LAB_001e9ff6;
  case UCAL_ZONE_OFFSET:
  case UCAL_DST_OFFSET:
    goto switchD_001e9e59_caseD_f;
  }
  local_40 = local_40 * dVar11;
  iVar8 = get(this,UCAL_DST_OFFSET,status);
  iVar5 = get(this,UCAL_ZONE_OFFSET,status);
  iVar9 = iVar5 + iVar8;
  iVar8 = get(this,UCAL_MILLISECONDS_IN_DAY,status);
  bVar3 = false;
LAB_001e9ff6:
  dVar11 = getTimeInMillis(this,status);
  setTimeInMillis(this,dVar11 + local_40,status);
  if ((!bVar3) && (iVar5 = get(this,UCAL_MILLISECONDS_IN_DAY,status), iVar5 != iVar8)) {
    base = this->fTime;
    iVar6 = get(this,UCAL_DST_OFFSET,status);
    iVar7 = get(this,UCAL_ZONE_OFFSET,status);
    uVar10 = iVar9 - (iVar7 + iVar6);
    if (uVar10 != 0) {
      if ((int)uVar10 < 0) {
        uVar10 = -(-uVar10 % 86400000);
      }
      else {
        uVar10 = uVar10 % 86400000;
      }
      if (uVar10 != 0) {
        setTimeInMillis(this,(double)(int)uVar10 + base,status);
        iVar5 = get(this,UCAL_MILLISECONDS_IN_DAY,status);
      }
      if (iVar5 != iVar8) {
        UVar2 = this->fSkippedWallTime;
        if (UVar2 == UCAL_WALLTIME_LAST) {
          if ((int)uVar10 < 0) {
LAB_001ea100:
            setTimeInMillis(this,base,status);
            return;
          }
        }
        else if (UVar2 == UCAL_WALLTIME_NEXT_VALID) {
          if (0 < (int)uVar10) {
            base = this->fTime;
          }
          UVar4 = getImmediatePreviousZoneTransition(this,base,&immediatePrevTrans,status);
          if ((UVar4 != '\0') && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
            setTimeInMillis(this,immediatePrevTrans,status);
          }
        }
        else if ((UVar2 == UCAL_WALLTIME_FIRST) && (0 < (int)uVar10)) goto LAB_001ea100;
      }
    }
  }
  return;
}

Assistant:

void Calendar::add(UCalendarDateFields field, int32_t amount, UErrorCode& status)
{
    if (amount == 0) {
        return;   // Do nothing!
    }

    // We handle most fields in the same way.  The algorithm is to add
    // a computed amount of millis to the current millis.  The only
    // wrinkle is with DST (and/or a change to the zone's UTC offset, which
    // we'll include with DST) -- for some fields, like the DAY_OF_MONTH,
    // we don't want the wall time to shift due to changes in DST.  If the
    // result of the add operation is to move from DST to Standard, or
    // vice versa, we need to adjust by an hour forward or back,
    // respectively.  For such fields we set keepWallTimeInvariant to TRUE.

    // We only adjust the DST for fields larger than an hour.  For
    // fields smaller than an hour, we cannot adjust for DST without
    // causing problems.  for instance, if you add one hour to April 5,
    // 1998, 1:00 AM, in PST, the time becomes "2:00 AM PDT" (an
    // illegal value), but then the adjustment sees the change and
    // compensates by subtracting an hour.  As a result the time
    // doesn't advance at all.

    // For some fields larger than a day, such as a UCAL_MONTH, we pin the
    // UCAL_DAY_OF_MONTH.  This allows <March 31>.add(UCAL_MONTH, 1) to be
    // <April 30>, rather than <April 31> => <May 1>.

    double delta = amount; // delta in ms
    UBool keepWallTimeInvariant = TRUE;

    switch (field) {
    case UCAL_ERA:
        set(field, get(field, status) + amount);
        pinField(UCAL_ERA, status);
        return;

    case UCAL_YEAR:
    case UCAL_YEAR_WOY:
      {
        // * If era=0 and years go backwards in time, change sign of amount.
        // * Until we have new API per #9393, we temporarily hardcode knowledge of
        //   which calendars have era 0 years that go backwards.
        // * Note that for UCAL_YEAR (but not UCAL_YEAR_WOY) we could instead handle
        //   this by applying the amount to the UCAL_EXTENDED_YEAR field; but since
        //   we would still need to handle UCAL_YEAR_WOY as below, might as well
        //   also handle UCAL_YEAR the same way.
        int32_t era = get(UCAL_ERA, status);
        if (era == 0) {
          const char * calType = getType();
          if ( uprv_strcmp(calType,"gregorian")==0 || uprv_strcmp(calType,"roc")==0 || uprv_strcmp(calType,"coptic")==0 ) {
            amount = -amount;
          }
        }
      }
      // Fall through into normal handling
      U_FALLTHROUGH;
    case UCAL_EXTENDED_YEAR:
    case UCAL_MONTH:
      {
        UBool oldLenient = isLenient();
        setLenient(TRUE);
        set(field, get(field, status) + amount);
        pinField(UCAL_DAY_OF_MONTH, status);
        if(oldLenient==FALSE) {
          complete(status); /* force recalculate */
          setLenient(oldLenient);
        }
      }
      return;

    case UCAL_WEEK_OF_YEAR:
    case UCAL_WEEK_OF_MONTH:
    case UCAL_DAY_OF_WEEK_IN_MONTH:
        delta *= kOneWeek;
        break;

    case UCAL_AM_PM:
        delta *= 12 * kOneHour;
        break;

    case UCAL_DAY_OF_MONTH:
    case UCAL_DAY_OF_YEAR:
    case UCAL_DAY_OF_WEEK:
    case UCAL_DOW_LOCAL:
    case UCAL_JULIAN_DAY:
        delta *= kOneDay;
        break;

    case UCAL_HOUR_OF_DAY:
    case UCAL_HOUR:
        delta *= kOneHour;
        keepWallTimeInvariant = FALSE;
        break;

    case UCAL_MINUTE:
        delta *= kOneMinute;
        keepWallTimeInvariant = FALSE;
        break;

    case UCAL_SECOND:
        delta *= kOneSecond;
        keepWallTimeInvariant = FALSE;
        break;

    case UCAL_MILLISECOND:
    case UCAL_MILLISECONDS_IN_DAY:
        keepWallTimeInvariant = FALSE;
        break;

    default:
#if defined (U_DEBUG_CAL)
        fprintf(stderr, "%s:%d: ILLEGAL ARG because field %s not addable",
            __FILE__, __LINE__, fldName(field));
#endif
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
        //  throw new IllegalArgumentException("Calendar.add(" + fieldName(field) +
        //                                     ") not supported");
    }

    // In order to keep the wall time invariant (for fields where this is
    // appropriate), check the combined DST & ZONE offset before and
    // after the add() operation. If it changes, then adjust the millis
    // to compensate.
    int32_t prevOffset = 0;
    int32_t prevWallTime = 0;
    if (keepWallTimeInvariant) {
        prevOffset = get(UCAL_DST_OFFSET, status) + get(UCAL_ZONE_OFFSET, status);
        prevWallTime = get(UCAL_MILLISECONDS_IN_DAY, status);
    }

    setTimeInMillis(getTimeInMillis(status) + delta, status);

    if (keepWallTimeInvariant) {
        int32_t newWallTime = get(UCAL_MILLISECONDS_IN_DAY, status);
        if (newWallTime != prevWallTime) {
            // There is at least one zone transition between the base
            // time and the result time. As the result, wall time has
            // changed.
            UDate t = internalGetTime();
            int32_t newOffset = get(UCAL_DST_OFFSET, status) + get(UCAL_ZONE_OFFSET, status);
            if (newOffset != prevOffset) {
                // When the difference of the previous UTC offset and
                // the new UTC offset exceeds 1 full day, we do not want
                // to roll over/back the date. For now, this only happens
                // in Samoa (Pacific/Apia) on Dec 30, 2011. See ticket:9452.
                int32_t adjAmount = prevOffset - newOffset;
                adjAmount = adjAmount >= 0 ? adjAmount % (int32_t)kOneDay : -(-adjAmount % (int32_t)kOneDay);
                if (adjAmount != 0) {
                    setTimeInMillis(t + adjAmount, status);
                    newWallTime = get(UCAL_MILLISECONDS_IN_DAY, status);
                }
                if (newWallTime != prevWallTime) {
                    // The result wall time or adjusted wall time was shifted because
                    // the target wall time does not exist on the result date.
                    switch (fSkippedWallTime) {
                    case UCAL_WALLTIME_FIRST:
                        if (adjAmount > 0) {
                            setTimeInMillis(t, status);
                        }
                        break;
                    case UCAL_WALLTIME_LAST:
                        if (adjAmount < 0) {
                            setTimeInMillis(t, status);
                        }
                        break;
                    case UCAL_WALLTIME_NEXT_VALID:
                        UDate tmpT = adjAmount > 0 ? internalGetTime() : t;
                        UDate immediatePrevTrans;
                        UBool hasTransition = getImmediatePreviousZoneTransition(tmpT, &immediatePrevTrans, status);
                        if (U_SUCCESS(status) && hasTransition) {
                            setTimeInMillis(immediatePrevTrans, status);
                        }
                        break;
                    }
                }
            }
        }
    }
}